

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterA.c
# Opt level: O0

int Inta_ManProofRecordOne(Inta_Man_t *p,Sto_Cls_t *pClause)

{
  lit *plVar1;
  int iVar2;
  lit Lit;
  Sto_Cls_t *pSVar3;
  uint local_30;
  uint local_2c;
  int j;
  int i;
  Sto_Cls_t *pConflict;
  Sto_Cls_t *pClause_local;
  Inta_Man_t *p_local;
  
  if ((*(uint *)&pClause->field_0x1c >> 3 & 0xffffff) == 0) {
    __assert_fail("pClause->nLits > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterA.c"
                  ,0x2d5,"int Inta_ManProofRecordOne(Inta_Man_t *, Sto_Cls_t *)");
  }
  if ((*(uint *)&pClause->field_0x1c >> 3 & 0xffffff) == 0) {
    printf("Error: Empty clause is attempted.\n");
  }
  if ((*(uint *)&pClause->field_0x1c >> 1 & 1) != 0) {
    __assert_fail("!pClause->fRoot",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterA.c"
                  ,0x2d9,"int Inta_ManProofRecordOne(Inta_Man_t *, Sto_Cls_t *)");
  }
  if (p->nTrailSize != p->nRootSize) {
    __assert_fail("p->nTrailSize == p->nRootSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterA.c"
                  ,0x2da,"int Inta_ManProofRecordOne(Inta_Man_t *, Sto_Cls_t *)");
  }
  for (local_2c = 0; (int)local_2c < (int)(*(uint *)&pClause->field_0x1c >> 3 & 0xffffff);
      local_2c = local_2c + 1) {
    plVar1 = p->pAssigns;
    iVar2 = lit_var(*(lit *)((long)&pClause[1].pNext + (long)(int)local_2c * 4));
    if (plVar1[iVar2] == *(int *)((long)&pClause[1].pNext + (long)(int)local_2c * 4)) {
      return 1;
    }
  }
  for (local_2c = 0; (int)local_2c < (int)(*(uint *)&pClause->field_0x1c >> 3 & 0xffffff);
      local_2c = local_2c + 1) {
    Lit = lit_neg(*(lit *)((long)&pClause[1].pNext + (long)(int)local_2c * 4));
    iVar2 = Inta_ManEnqueue(p,Lit,(Sto_Cls_t *)0x0);
    if (iVar2 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterA.c"
                    ,0x2e6,"int Inta_ManProofRecordOne(Inta_Man_t *, Sto_Cls_t *)");
    }
  }
  pSVar3 = Inta_ManPropagate(p,p->nRootSize);
  if (pSVar3 == (Sto_Cls_t *)0x0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterA.c"
                  ,0x2ee,"int Inta_ManProofRecordOne(Inta_Man_t *, Sto_Cls_t *)");
  }
  if ((*(uint *)&pSVar3->field_0x1c >> 3 & 0xffffff) <=
      (*(uint *)&pClause->field_0x1c >> 3 & 0xffffff)) {
    for (local_2c = 0; (int)local_2c < (int)(*(uint *)&pSVar3->field_0x1c >> 3 & 0xffffff);
        local_2c = local_2c + 1) {
      local_30 = 0;
      while (((int)local_30 < (int)(*(uint *)&pClause->field_0x1c >> 3 & 0xffffff) &&
             (*(int *)((long)&pSVar3[1].pNext + (long)(int)local_2c * 4) !=
              *(int *)((long)&pClause[1].pNext + (long)(int)local_30 * 4)))) {
        local_30 = local_30 + 1;
      }
      if (local_30 == (*(uint *)&pClause->field_0x1c >> 3 & 0xffffff)) break;
    }
    if (local_2c == (*(uint *)&pSVar3->field_0x1c >> 3 & 0xffffff)) {
      Inta_ManCancelUntil(p,p->nRootSize);
      return 1;
    }
  }
  Inta_ManProofTraceOne(p,pSVar3,pClause);
  Inta_ManCancelUntil(p,p->nRootSize);
  if ((*(uint *)&pClause->field_0x1c >> 3 & 0xffffff) < 2) {
    if ((*(uint *)&pClause->field_0x1c >> 3 & 0xffffff) != 1) {
      __assert_fail("pClause->nLits == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterA.c"
                    ,0x314,"int Inta_ManProofRecordOne(Inta_Man_t *, Sto_Cls_t *)");
    }
    iVar2 = Inta_ManEnqueue(p,*(lit *)&pClause[1].pNext,pClause);
    if (iVar2 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterA.c"
                    ,0x319,"int Inta_ManProofRecordOne(Inta_Man_t *, Sto_Cls_t *)");
    }
    pSVar3 = Inta_ManPropagate(p,p->nRootSize);
    if (pSVar3 == (Sto_Cls_t *)0x0) {
      p->nRootSize = p->nTrailSize;
      p_local._4_4_ = 1;
    }
    else {
      Inta_ManProofTraceOne(p,pSVar3,p->pCnf->pEmpty);
      p_local._4_4_ = 0;
    }
  }
  else {
    Inta_ManWatchClause(p,pClause,*(lit *)&pClause[1].pNext);
    Inta_ManWatchClause(p,pClause,*(lit *)((long)&pClause[1].pNext + 4));
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int Inta_ManProofRecordOne( Inta_Man_t * p, Sto_Cls_t * pClause )
{
    Sto_Cls_t * pConflict;
    int i;

    // empty clause never ends up there
    assert( pClause->nLits > 0 );
    if ( pClause->nLits == 0 )
        printf( "Error: Empty clause is attempted.\n" );

    assert( !pClause->fRoot );
    assert( p->nTrailSize == p->nRootSize );

    // if any of the clause literals are already assumed
    // it means that the clause is redundant and can be skipped
    for ( i = 0; i < (int)pClause->nLits; i++ )
        if ( p->pAssigns[lit_var(pClause->pLits[i])] == pClause->pLits[i] )
            return 1;

    // add assumptions to the trail
    for ( i = 0; i < (int)pClause->nLits; i++ )
        if ( !Inta_ManEnqueue( p, lit_neg(pClause->pLits[i]), NULL ) )
        {
            assert( 0 ); // impossible
            return 0;
        }

    // propagate the assumptions
    pConflict = Inta_ManPropagate( p, p->nRootSize );
    if ( pConflict == NULL )
    {
        assert( 0 ); // cannot prove
        return 0;
    } 

    // skip the clause if it is weaker or the same as the conflict clause
    if ( pClause->nLits >= pConflict->nLits )
    {
        // check if every literal of conflict clause can be found in the given clause
        int j;
        for ( i = 0; i < (int)pConflict->nLits; i++ )
        {
            for ( j = 0; j < (int)pClause->nLits; j++ )
                if ( pConflict->pLits[i] == pClause->pLits[j] )
                    break;
            if ( j == (int)pClause->nLits ) // literal pConflict->pLits[i] is not found
                break;
        }
        if ( i == (int)pConflict->nLits ) // all lits are found
        {
            // undo to the root level
            Inta_ManCancelUntil( p, p->nRootSize );
            return 1;
        }
    }

    // construct the proof
    Inta_ManProofTraceOne( p, pConflict, pClause );

    // undo to the root level
    Inta_ManCancelUntil( p, p->nRootSize );

    // add large clauses to the watched lists
    if ( pClause->nLits > 1 )
    {
        Inta_ManWatchClause( p, pClause, pClause->pLits[0] );
        Inta_ManWatchClause( p, pClause, pClause->pLits[1] );
        return 1;
    }
    assert( pClause->nLits == 1 );

    // if the clause proved is unit, add it and propagate
    if ( !Inta_ManEnqueue( p, pClause->pLits[0], pClause ) )
    {
        assert( 0 ); // impossible
        return 0;
    }

    // propagate the assumption
    pConflict = Inta_ManPropagate( p, p->nRootSize );
    if ( pConflict )
    {
        // construct the proof
        Inta_ManProofTraceOne( p, pConflict, p->pCnf->pEmpty );
//        if ( p->fVerbose )
//            printf( "Found last conflict after adding unit clause number %d!\n", pClause->Id );
        return 0;
    }

    // update the root level
    p->nRootSize = p->nTrailSize;
    return 1;
}